

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O3

TableResource * table_open(SRBRoot *bundle,char *tag,UString *comment,UErrorCode *status)

{
  TableResource *this;
  
  this = (TableResource *)operator_new(0x58);
  SResource::SResource((SResource *)this,bundle,tag,'\x02',comment,status);
  (this->super_ContainerResource).fCount = 0;
  (this->super_ContainerResource).fFirst = (SResource *)0x0;
  (this->super_ContainerResource).super_SResource._vptr_SResource =
       (_func_int **)&PTR__ArrayResource_004714f0;
  this->fTableType = 2;
  this->fRoot = bundle;
  if (U_ZERO_ERROR < *status) {
    ArrayResource::~ArrayResource((ArrayResource *)this);
    operator_delete(this);
    this = (TableResource *)0x0;
  }
  return this;
}

Assistant:

TableResource* table_open(struct SRBRoot *bundle, const char *tag, const struct UString* comment, UErrorCode *status) {
    LocalPointer<TableResource> res(new TableResource(bundle, tag, comment, *status), *status);
    return U_SUCCESS(*status) ? res.orphan() : NULL;
}